

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletload_tests.cpp
# Opt level: O3

void __thiscall wallet::walletload_tests::wallet_load_ckey::test_method(wallet_load_ckey *this)

{
  Chain *pCVar1;
  WalletDatabase *pWVar2;
  MockableData records_00;
  MockableData records_01;
  MockableData records_02;
  MockableData records_03;
  MockableData records_04;
  pointer pbVar3;
  bool bVar4;
  readonly_property<bool> rVar5;
  undefined1 uVar6;
  int iVar7;
  DBErrors DVar8;
  CWallet *pCVar9;
  LegacyScriptPubKeyMan *pLVar10;
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *this_00;
  T *__rhs;
  MockableDatabase *pMVar11;
  mapped_type *pmVar12;
  CPubKey *pCVar13;
  iterator in_R8;
  char *pcVar14;
  iterator pvVar15;
  iterator in_R9;
  iterator pvVar16;
  pointer *__ptr;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  shared_ptr<wallet::CWallet> wallet;
  shared_ptr<wallet::CWallet> wallet_4;
  SerializeData ckey_record_value;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock6;
  CPubKey invalid_key;
  CTxDestination dest;
  MockableData records;
  CKeyID key_id;
  undefined4 in_stack_fffffffffffff928;
  undefined4 uVar17;
  undefined4 in_stack_fffffffffffff92c;
  undefined4 uVar18;
  check_type cVar22;
  undefined8 in_stack_fffffffffffff938;
  string *psVar19;
  undefined8 in_stack_fffffffffffff940;
  char *pcVar20;
  undefined8 in_stack_fffffffffffff948;
  undefined1 *puVar21;
  assertion_result *ar;
  assertion_result *ar_00;
  size_t in_stack_fffffffffffff950;
  undefined4 local_6a0;
  DBErrors local_69c;
  assertion_result local_698;
  char *local_680;
  undefined1 *local_678;
  undefined1 *local_670;
  char *local_668;
  char *local_660;
  long *local_658;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_650;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  long *local_5e8;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  long *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  long *local_358;
  char *local_350;
  char *local_348;
  undefined1 local_340 [32];
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 local_2e0 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  long *local_2a0;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_298;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_278;
  undefined8 local_260;
  assertion_result local_258;
  char *local_240;
  undefined1 local_230 [16];
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_220;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_1f0;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_1c0;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_190;
  undefined1 local_160 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150 [4];
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_f8 [4];
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_b8;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_80;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_278._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  pCVar9 = (CWallet *)operator_new(0x4a8);
  pCVar1 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain.
           _M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
           _M_t.super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
           .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  local_160._0_8_ = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"");
  local_b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8._M_impl.super__Rb_tree_header._M_header;
  local_b8._M_impl._0_8_ = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  records_00._M_t._M_impl._4_4_ = in_stack_fffffffffffff92c;
  records_00._M_t._M_impl._0_4_ = in_stack_fffffffffffff928;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (undefined8)_cVar22;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffff938;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffff940;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffff948;
  records_00._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffff950;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateMockableWalletDatabase((wallet *)&local_2a0,records_00);
  CWallet::CWallet(pCVar9,pCVar1,(string *)local_160,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                   )&local_2a0);
  local_650._M_impl.super__Vector_impl_data._M_start = (pointer)pCVar9;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<wallet::CWallet*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_650._M_impl.super__Vector_impl_data._M_finish,pCVar9);
  if (local_2a0 != (long *)0x0) {
    (**(code **)(*local_2a0 + 8))();
  }
  local_2a0 = (long *)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._0_8_ != local_150) {
    operator_delete((void *)local_160._0_8_,local_150[0]._M_allocated_capacity + 1);
  }
  local_230._0_8_ = (long)local_650._M_impl.super__Vector_impl_data._M_start + 0x1e8;
  local_230._8_8_ = local_230._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_230);
  pLVar10 = CWallet::GetOrCreateLegacyScriptPubKeyMan
                      ((CWallet *)local_650._M_impl.super__Vector_impl_data._M_start);
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x7e;
  file.m_begin = (iterator)&local_2b0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2c0,msg);
  iVar7 = (*(pLVar10->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0xb])
                    (pLVar10,1);
  local_108[0] = (class_property<bool>)SUB41(iVar7,0);
  local_108._8_8_ = (element_type *)0x0;
  aaStack_f8[0]._M_allocated_capacity = (sp_counted_base *)0x0;
  local_150[0]._8_8_ = &local_258;
  local_258._0_8_ = "legacy_spkm->SetupGeneration(true)";
  local_258.m_message.px = (element_type *)0xf6674c;
  local_160[8] = false;
  local_160._0_8_ = &PTR__lazy_ostream_01389048;
  local_150[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_2c8 = "";
  pvVar15 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_108,(lazy_ostream *)local_160,1,0,WARN,_cVar22,
             (size_t)&local_2d0,0x7e);
  boost::detail::shared_count::~shared_count((shared_count *)&aaStack_f8[0]._M_allocated_capacity);
  (*(pLVar10->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[2])
            (local_160,pLVar10,0);
  pcVar14 = "legacy_spkm->GetNewDestination(OutputType::LEGACY)";
  this_00 = inline_assertion_check<true,util::Result<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>>
                      ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                        *)local_160,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
                       ,0x81,"test_method","legacy_spkm->GetNewDestination(OutputType::LEGACY)");
  __rhs = util::
          Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
          ::value(this_00);
  std::__detail::__variant::
  _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)local_108,
                    (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)__rhs);
  std::__detail::__variant::
  _Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                       *)local_160);
  GetKeyForDestination
            ((CKeyID *)&local_50,
             &(pLVar10->super_LegacyDataSPKM).super_FillableSigningProvider.super_SigningProvider,
             (CTxDestination *)local_108);
  local_2e0 = (undefined1  [8])((ulong)local_2e0 & 0xffffffffffffff00);
  local_2d8._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x84;
  file_00.m_begin = (iterator)&local_2f0;
  msg_00.m_end = pvVar15;
  msg_00.m_begin = pcVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_300,
             msg_00);
  iVar7 = (*(pLVar10->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1e])
                    (pLVar10,&local_50,local_2e0);
  local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(char)iVar7;
  local_258.m_message.px = (element_type *)0x0;
  local_258.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_150[0]._8_8_ = &local_698;
  local_698._0_8_ = "legacy_spkm->GetKey(key_id, first_key)";
  local_698.m_message.px = (element_type *)0xf66c37;
  local_160[8] = false;
  local_160._0_8_ = &PTR__lazy_ostream_01389048;
  local_150[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_308 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_258,(lazy_ostream *)local_160,1,0,WARN,_cVar22,(size_t)&local_310,0x84);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_318 = "";
  local_340._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_340._24_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x87;
  file_01.m_begin = (iterator)&local_320;
  msg_01.m_end = pvVar16;
  msg_01.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
             (size_t)(local_340 + 0x10),msg_01);
  pbVar3 = local_650._M_impl.super__Vector_impl_data._M_start;
  local_160._0_8_ = local_150;
  std::__cxx11::basic_string<char,std::char_traits<char>,secure_allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,secure_allocator<char>> *)local_160,"encrypt"
             ,"");
  bVar4 = CWallet::EncryptWallet((CWallet *)pbVar3,(SecureString *)local_160);
  local_698.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar4;
  local_698.m_message.px = (element_type *)0x0;
  local_698.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_240 = local_340;
  local_340._0_8_ = "wallet->EncryptWallet(\"encrypt\")";
  local_340._8_8_ = (long)"wallet->EncryptWallet(\"encrypt\")" + 0x20;
  local_258.m_message.px = (element_type *)((ulong)local_258.m_message.px & 0xffffffffffffff00);
  local_258._0_8_ = &PTR__lazy_ostream_01389048;
  local_258.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_348 = "";
  uVar17 = 0;
  uVar18 = 0;
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  pCVar13 = (CPubKey *)0x87;
  boost::test_tools::tt_detail::report_assertion
            (&local_698,(lazy_ostream *)&local_258,1,0,WARN,_cVar22,(size_t)&local_350,0x87);
  boost::detail::shared_count::~shared_count(&local_698.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._0_8_ != local_150) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::_M_destroy
              ((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)local_160,
               local_150[0]._M_allocated_capacity);
  }
  CWallet::Flush((CWallet *)local_650._M_impl.super__Vector_impl_data._M_start);
  pMVar11 = GetMockableDatabase((CWallet *)local_650._M_impl.super__Vector_impl_data._M_start);
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::operator=(&local_80,&(pMVar11->m_records)._M_t);
  CKey::GetPubKey((CPubKey *)local_160,(CKey *)local_2e0);
  MakeSerializeData<std::__cxx11::string,CPubKey>
            ((SerializeData *)&local_698,(walletload_tests *)&DBKeys::CRYPTED_KEY_abi_cxx11_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,pCVar13)
  ;
  local_258.m_message.pn.pi_ =
       (sp_counted_base *)local_278._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_258.m_message.px = (element_type *)local_278._M_impl.super__Vector_impl_data._M_finish;
  local_258._0_8_ = local_278._M_impl.super__Vector_impl_data._M_start;
  local_278._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_698.m_message.pn.pi_;
  local_278._M_impl.super__Vector_impl_data._M_start = (pointer)local_698._0_8_;
  local_278._M_impl.super__Vector_impl_data._M_finish = (pointer)local_698.m_message.px;
  local_698._0_8_ = (_func_int **)0x0;
  local_698.m_message.px = (element_type *)0x0;
  local_698.m_message.pn.pi_ = (sp_counted_base *)0x0;
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_258);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_698);
  pmVar12 = std::
            map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
            ::at((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                  *)&local_80,(key_type *)&local_278);
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::operator=
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_298,pmVar12);
  if (local_2d8._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_2d8,
               local_2d8._M_head_impl);
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_108);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_230);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_650._M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_650._M_impl.super__Vector_impl_data._M_finish);
  }
  pCVar9 = (CWallet *)operator_new(0x4a8);
  pCVar1 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain.
           _M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
           _M_t.super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
           .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  local_160._0_8_ = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"","");
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::_Rb_tree(&local_190,&local_80);
  records_01._M_t._M_impl._4_4_ = uVar18;
  records_01._M_t._M_impl._0_4_ = uVar17;
  records_01._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (undefined8)_cVar22;
  records_01._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffff938;
  records_01._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffff940;
  records_01._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffff948;
  records_01._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffff950;
  CreateMockableWalletDatabase((wallet *)&local_358,records_01);
  psVar19 = (string *)local_160;
  CWallet::CWallet(pCVar9,pCVar1,psVar19,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                   )&local_358);
  local_650._M_impl.super__Vector_impl_data._M_start = (pointer)pCVar9;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<wallet::CWallet*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_650._M_impl.super__Vector_impl_data._M_finish,pCVar9);
  if (local_358 != (long *)0x0) {
    (**(code **)(*local_358 + 8))();
  }
  local_358 = (long *)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._0_8_ != local_150) {
    operator_delete((void *)local_160._0_8_,(ulong)(local_150[0]._M_allocated_capacity + 1));
  }
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x9b;
  file_02.m_begin = (iterator)&local_368;
  msg_02.m_end = pvVar16;
  msg_02.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_378,
             msg_02);
  local_258.m_message.px = (element_type *)((ulong)local_258.m_message.px & 0xffffffffffffff00);
  local_258._0_8_ = &PTR__lazy_ostream_01388f08;
  local_258.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_240 = "";
  DVar8 = CWallet::LoadWallet((CWallet *)local_650._M_impl.super__Vector_impl_data._M_start);
  local_340._0_4_ = DVar8;
  local_2e0 = (undefined1  [8])&local_260;
  local_260 = (undefined4 *)((ulong)local_260._4_4_ << 0x20);
  local_698.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(DVar8 == LOAD_OK);
  local_698.m_message.px = (element_type *)0x0;
  local_698.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_50._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_50.m_message.px = (element_type *)0xf668d3;
  local_230._0_8_ = local_340;
  local_160[8] = false;
  local_160._0_8_ = &PTR__lazy_ostream_01390308;
  local_150[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
  local_150[0]._8_8_ = local_230;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108._0_8_ = &PTR__lazy_ostream_01390308;
  aaStack_f8[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
  aaStack_f8[0]._8_8_ = local_2e0;
  puVar21 = local_108;
  pcVar20 = "DBErrors::LOAD_OK";
  pcVar14 = "wallet->LoadWallet()";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_698,(lazy_ostream *)&local_258,1,2,REQUIRE,0xf653ba,(size_t)&local_50,0x9b);
  boost::detail::shared_count::~shared_count(&local_698.m_message.pn);
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x9c;
  file_03.m_begin = (iterator)&local_388;
  msg_03.m_end = pvVar16;
  msg_03.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_398,
             msg_03);
  rVar5.super_class_property<bool>.value =
       (class_property<bool>)
       CWallet::IsCrypted((CWallet *)local_650._M_impl.super__Vector_impl_data._M_start);
  local_108._8_8_ = (element_type *)0x0;
  aaStack_f8[0]._M_allocated_capacity = (sp_counted_base *)0x0;
  local_258._0_8_ = "wallet->IsCrypted()";
  local_258.m_message.px = (element_type *)0xf66c6c;
  local_160[8] = false;
  local_160._0_8_ = &PTR__lazy_ostream_01389048;
  local_150[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_3a0 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_150[0]._8_8_ = (lazy_ostream *)&local_258;
  local_108[0] = rVar5.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_108,(lazy_ostream *)local_160,1,0,WARN,(check_type)pcVar14,
             (size_t)&local_3a8,0x9c);
  boost::detail::shared_count::~shared_count((shared_count *)&aaStack_f8[0]._M_allocated_capacity);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x9d;
  file_04.m_begin = (iterator)&local_3b8;
  msg_04.m_end = pvVar16;
  msg_04.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3c8,
             msg_04);
  pWVar2 = (((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
            ((long)local_650._M_impl.super__Vector_impl_data._M_start + 0xe0))->_M_t).
           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
  if (pWVar2 != (WalletDatabase *)0x0) {
    local_108[0] = HasAnyRecordOfType(pWVar2,(string *)&DBKeys::CRYPTED_KEY_abi_cxx11_);
    local_108._8_8_ = (element_type *)0x0;
    aaStack_f8[0]._M_allocated_capacity = (sp_counted_base *)0x0;
    local_258._0_8_ = "HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY)";
    local_258.m_message.px = (element_type *)0xf66cac;
    local_160[8] = false;
    local_160._0_8_ = &PTR__lazy_ostream_01389048;
    local_150[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
    local_3d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
    ;
    local_3d0 = "";
    pvVar15 = (iterator)0x1;
    pvVar16 = (iterator)0x0;
    local_150[0]._8_8_ = (lazy_ostream *)&local_258;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_108,(lazy_ostream *)local_160,1,0,WARN,(check_type)pcVar14,
               (size_t)&local_3d8,0x9d);
    boost::detail::shared_count::~shared_count((shared_count *)&aaStack_f8[0]._M_allocated_capacity)
    ;
    local_3e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
    ;
    local_3e0 = "";
    local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0xa0;
    file_05.m_begin = (iterator)&local_3e8;
    msg_05.m_end = pvVar16;
    msg_05.m_begin = pvVar15;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3f8,
               msg_05);
    pLVar10 = CWallet::GetLegacyScriptPubKeyMan
                        ((CWallet *)local_650._M_impl.super__Vector_impl_data._M_start);
    local_108[0] = LegacyDataSPKM::DeleteRecords(&pLVar10->super_LegacyDataSPKM);
    local_108._8_8_ = (element_type *)0x0;
    aaStack_f8[0]._M_allocated_capacity = (sp_counted_base *)0x0;
    local_258._0_8_ = "wallet->GetLegacyScriptPubKeyMan()->DeleteRecords()";
    local_258.m_message.px = (element_type *)0xf66780;
    local_160[8] = false;
    local_160._0_8_ = &PTR__lazy_ostream_01389048;
    local_150[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
    local_408 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
    ;
    local_400 = "";
    pvVar15 = (iterator)0x1;
    pvVar16 = (iterator)0x0;
    local_150[0]._8_8_ = (lazy_ostream *)&local_258;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_108,(lazy_ostream *)local_160,1,0,WARN,(check_type)pcVar14,
               (size_t)&local_408,0xa0);
    boost::detail::shared_count::~shared_count((shared_count *)&aaStack_f8[0]._M_allocated_capacity)
    ;
    local_418 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
    ;
    local_410 = "";
    local_428 = &boost::unit_test::basic_cstring<char_const>::null;
    local_420 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0xa1;
    file_06.m_begin = (iterator)&local_418;
    msg_06.m_end = pvVar16;
    msg_06.m_begin = pvVar15;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_428,
               msg_06);
    pWVar2 = (((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
              ((long)local_650._M_impl.super__Vector_impl_data._M_start + 0xe0))->_M_t).
             super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
             .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
    if (pWVar2 != (WalletDatabase *)0x0) {
      bVar4 = HasAnyRecordOfType(pWVar2,(string *)&DBKeys::CRYPTED_KEY_abi_cxx11_);
      local_108[0] = !bVar4;
      local_108._8_8_ = (element_type *)0x0;
      aaStack_f8[0]._M_allocated_capacity = (sp_counted_base *)0x0;
      local_258._0_8_ = "!HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY)";
      local_258.m_message.px = (element_type *)0xf66cac;
      local_160[8] = false;
      local_160._0_8_ = &PTR__lazy_ostream_01389048;
      local_150[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
      local_438 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
      ;
      local_430 = "";
      pvVar15 = (iterator)0x1;
      pvVar16 = (iterator)0x0;
      local_150[0]._8_8_ = (lazy_ostream *)&local_258;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_108,(lazy_ostream *)local_160,1,0,WARN,
                 (check_type)pcVar14,(size_t)&local_438,0xa1);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&aaStack_f8[0]._M_allocated_capacity);
      local_448 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
      ;
      local_440 = "";
      local_458 = &boost::unit_test::basic_cstring<char_const>::null;
      local_450 = &boost::unit_test::basic_cstring<char_const>::null;
      file_07.m_end = (iterator)0xa2;
      file_07.m_begin = (iterator)&local_448;
      msg_07.m_end = pvVar16;
      msg_07.m_begin = pvVar15;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_458,
                 msg_07);
      pbVar3 = local_650._M_impl.super__Vector_impl_data._M_start;
      local_160._0_8_ = local_150;
      std::__cxx11::basic_string<char,std::char_traits<char>,secure_allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,secure_allocator<char>> *)local_160,
                 "encrypt","");
      bVar4 = CWallet::Unlock((CWallet *)pbVar3,(SecureString *)local_160);
      local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)bVar4;
      local_258.m_message.px = (element_type *)0x0;
      local_258.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_698._0_8_ = "wallet->Unlock(\"encrypt\")";
      local_698.m_message.px = (element_type *)0xf66cc6;
      local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
      local_108[0] = (class_property<bool>)0x48;
      local_108._1_7_ = 0x13890;
      aaStack_f8[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
      local_468 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
      ;
      local_460 = "";
      pvVar15 = (iterator)0x1;
      pvVar16 = (iterator)0x0;
      aaStack_f8[0]._8_8_ = &local_698;
      boost::test_tools::tt_detail::report_assertion
                (&local_258,(lazy_ostream *)local_108,1,0,WARN,(check_type)pcVar14,
                 (size_t)&local_468,0xa2);
      boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._0_8_ != local_150) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::
        _M_destroy((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)local_160,
                   local_150[0]._M_allocated_capacity);
      }
      local_478 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
      ;
      local_470 = "";
      local_488 = &boost::unit_test::basic_cstring<char_const>::null;
      local_480 = &boost::unit_test::basic_cstring<char_const>::null;
      file_08.m_end = (iterator)0xa3;
      file_08.m_begin = (iterator)&local_478;
      msg_08.m_end = pvVar16;
      msg_08.m_begin = pvVar15;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_488,
                 msg_08);
      pWVar2 = (((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *
                 )((long)local_650._M_impl.super__Vector_impl_data._M_start + 0xe0))->_M_t).
               super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
               ._M_t.
               super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
               .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
      if (pWVar2 != (WalletDatabase *)0x0) {
        bVar4 = HasAnyRecordOfType(pWVar2,(string *)&DBKeys::CRYPTED_KEY_abi_cxx11_);
        ar = (assertion_result *)local_108;
        local_108[0] = !bVar4;
        local_108._8_8_ = (element_type *)0x0;
        aaStack_f8[0]._M_allocated_capacity = (sp_counted_base *)0x0;
        local_258._0_8_ = "!HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY)";
        local_258.m_message.px = (element_type *)0xf66cac;
        local_160[8] = false;
        local_160._0_8_ = &PTR__lazy_ostream_01389048;
        local_150[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
        local_498 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
        ;
        local_490 = "";
        uVar17 = 0;
        uVar18 = 0;
        pvVar15 = (iterator)0x1;
        pvVar16 = (iterator)0x0;
        local_150[0]._8_8_ = &local_258;
        boost::test_tools::tt_detail::report_assertion
                  (ar,(lazy_ostream *)local_160,1,0,WARN,(check_type)pcVar14,(size_t)&local_498,0xa3
                  );
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&aaStack_f8[0]._M_allocated_capacity);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_650._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_650._M_impl.super__Vector_impl_data._M_finish);
        }
        pmVar12 = std::
                  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                  ::operator[]((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                                *)&local_80,(key_type *)&local_278);
        std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::resize
                  (pmVar12,(size_type)
                           (local_298._M_impl.super__Vector_impl_data._M_finish +
                           (-0x20 - (long)local_298._M_impl.super__Vector_impl_data._M_start)));
        pCVar9 = (CWallet *)operator_new(0x4a8);
        pCVar1 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                 chain._M_t.
                 super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                 .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
        local_160._0_8_ = local_150;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"","");
        std::
        _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
        ::_Rb_tree(&local_1c0,&local_80);
        records_02._M_t._M_impl._4_4_ = uVar18;
        records_02._M_t._M_impl._0_4_ = uVar17;
        records_02._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pcVar14;
        records_02._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)psVar19;
        records_02._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pcVar20;
        records_02._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)puVar21;
        records_02._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffff950;
        CreateMockableWalletDatabase((wallet *)&local_4a0,records_02);
        psVar19 = (string *)local_160;
        CWallet::CWallet(pCVar9,pCVar1,psVar19,
                         (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                          )&local_4a0);
        local_650._M_impl.super__Vector_impl_data._M_start = (pointer)pCVar9;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<wallet::CWallet*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_650._M_impl.super__Vector_impl_data._M_finish,pCVar9);
        if (local_4a0 != (long *)0x0) {
          (**(code **)(*local_4a0 + 8))();
        }
        local_4a0 = (long *)0x0;
        std::
        _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
        ::~_Rb_tree(&local_1c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._0_8_ != local_150) {
          operator_delete((void *)local_160._0_8_,(ulong)(local_150[0]._M_allocated_capacity + 1));
        }
        local_4b0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
        ;
        local_4a8 = "";
        local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_09.m_end = (iterator)0xaf;
        file_09.m_begin = (iterator)&local_4b0;
        msg_09.m_end = pvVar16;
        msg_09.m_begin = pvVar15;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_4c0
                   ,msg_09);
        local_258.m_message.px =
             (element_type *)((ulong)local_258.m_message.px & 0xffffffffffffff00);
        local_258._0_8_ = &PTR__lazy_ostream_01388f08;
        local_258.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_240 = "";
        DVar8 = CWallet::LoadWallet((CWallet *)local_650._M_impl.super__Vector_impl_data._M_start);
        local_340._0_4_ = DVar8;
        local_260 = (undefined4 *)((ulong)local_260 & 0xffffffff00000000);
        local_698.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(readonly_property<bool>)(DVar8 == LOAD_OK);
        local_698.m_message.px = (element_type *)0x0;
        local_698.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_50._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
        ;
        local_50.m_message.px = (element_type *)0xf668d3;
        local_230._0_8_ = local_340;
        local_160[8] = false;
        local_160._0_8_ = &PTR__lazy_ostream_01390308;
        local_150[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
        local_150[0]._8_8_ = local_230;
        local_2e0 = (undefined1  [8])&local_260;
        local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
        local_108._0_8_ = &PTR__lazy_ostream_01390308;
        aaStack_f8[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
        aaStack_f8[0]._8_8_ = local_2e0;
        pcVar20 = "DBErrors::LOAD_OK";
        pcVar14 = "wallet->LoadWallet()";
        pvVar15 = (iterator)0x1;
        pvVar16 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  (&local_698,(lazy_ostream *)&local_258,1,2,REQUIRE,0xf653ba,(size_t)&local_50,0xaf
                  );
        boost::detail::shared_count::~shared_count(&local_698.m_message.pn);
        local_4d0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
        ;
        local_4c8 = "";
        local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_10.m_end = (iterator)0xb0;
        file_10.m_begin = (iterator)&local_4d0;
        msg_10.m_end = pvVar16;
        msg_10.m_begin = pvVar15;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_4e0
                   ,msg_10);
        rVar5.super_class_property<bool>.value =
             (class_property<bool>)
             CWallet::IsCrypted((CWallet *)local_650._M_impl.super__Vector_impl_data._M_start);
        local_108._8_8_ = (element_type *)0x0;
        aaStack_f8[0]._M_allocated_capacity = (sp_counted_base *)0x0;
        local_258._0_8_ = "wallet->IsCrypted()";
        local_258.m_message.px = (element_type *)0xf66c6c;
        local_160[8] = false;
        local_160._0_8_ = &PTR__lazy_ostream_01389048;
        local_150[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
        local_4f0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
        ;
        local_4e8 = "";
        pvVar15 = (iterator)0x1;
        pvVar16 = (iterator)0x0;
        local_150[0]._8_8_ = (lazy_ostream *)&local_258;
        local_108[0] = rVar5.super_class_property<bool>.value;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_108,(lazy_ostream *)local_160,1,0,WARN,
                   (check_type)pcVar14,(size_t)&local_4f0,0xb0);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&aaStack_f8[0]._M_allocated_capacity);
        local_500 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
        ;
        local_4f8 = "";
        local_510 = &boost::unit_test::basic_cstring<char_const>::null;
        local_508 = &boost::unit_test::basic_cstring<char_const>::null;
        file_11.m_end = (iterator)0xb1;
        file_11.m_begin = (iterator)&local_500;
        msg_11.m_end = pvVar16;
        msg_11.m_begin = pvVar15;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_510
                   ,msg_11);
        pWVar2 = (((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                    *)((long)local_650._M_impl.super__Vector_impl_data._M_start + 0xe0))->_M_t).
                 super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                 .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
        if (pWVar2 != (WalletDatabase *)0x0) {
          local_108[0] = HasAnyRecordOfType(pWVar2,(string *)&DBKeys::CRYPTED_KEY_abi_cxx11_);
          local_108._8_8_ = (element_type *)0x0;
          aaStack_f8[0]._M_allocated_capacity = (sp_counted_base *)0x0;
          local_258._0_8_ = "HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY)";
          local_258.m_message.px = (element_type *)0xf66cac;
          local_160[8] = false;
          local_160._0_8_ = &PTR__lazy_ostream_01389048;
          local_150[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
          local_520 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
          ;
          local_518 = "";
          pvVar15 = (iterator)0x1;
          pvVar16 = (iterator)0x0;
          local_150[0]._8_8_ = (lazy_ostream *)&local_258;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_108,(lazy_ostream *)local_160,1,0,WARN,
                     (check_type)pcVar14,(size_t)&local_520,0xb1);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&aaStack_f8[0]._M_allocated_capacity);
          local_530 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
          ;
          local_528 = "";
          local_540 = &boost::unit_test::basic_cstring<char_const>::null;
          local_538 = &boost::unit_test::basic_cstring<char_const>::null;
          file_12.m_end = (iterator)0xb5;
          file_12.m_begin = (iterator)&local_530;
          msg_12.m_end = pvVar16;
          msg_12.m_begin = pvVar15;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,
                     (size_t)&local_540,msg_12);
          pLVar10 = CWallet::GetLegacyScriptPubKeyMan
                              ((CWallet *)local_650._M_impl.super__Vector_impl_data._M_start);
          local_108[0] = LegacyDataSPKM::DeleteRecords(&pLVar10->super_LegacyDataSPKM);
          local_108._8_8_ = (element_type *)0x0;
          aaStack_f8[0]._M_allocated_capacity = (sp_counted_base *)0x0;
          local_258._0_8_ = "wallet->GetLegacyScriptPubKeyMan()->DeleteRecords()";
          local_258.m_message.px = (element_type *)0xf66780;
          local_160[8] = false;
          local_160._0_8_ = &PTR__lazy_ostream_01389048;
          local_150[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
          local_550 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
          ;
          local_548 = "";
          pvVar15 = (iterator)0x1;
          pvVar16 = (iterator)0x0;
          local_150[0]._8_8_ = (lazy_ostream *)&local_258;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_108,(lazy_ostream *)local_160,1,0,WARN,
                     (check_type)pcVar14,(size_t)&local_550,0xb5);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&aaStack_f8[0]._M_allocated_capacity);
          local_560 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
          ;
          local_558 = "";
          local_570 = &boost::unit_test::basic_cstring<char_const>::null;
          local_568 = &boost::unit_test::basic_cstring<char_const>::null;
          file_13.m_end = (iterator)0xb6;
          file_13.m_begin = (iterator)&local_560;
          msg_13.m_end = pvVar16;
          msg_13.m_begin = pvVar15;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,
                     (size_t)&local_570,msg_13);
          pWVar2 = (((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                      *)((long)local_650._M_impl.super__Vector_impl_data._M_start + 0xe0))->_M_t).
                   super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                   .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
          if (pWVar2 != (WalletDatabase *)0x0) {
            bVar4 = HasAnyRecordOfType(pWVar2,(string *)&DBKeys::CRYPTED_KEY_abi_cxx11_);
            local_108[0] = !bVar4;
            local_108._8_8_ = (element_type *)0x0;
            aaStack_f8[0]._M_allocated_capacity = (sp_counted_base *)0x0;
            local_258._0_8_ = "!HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY)";
            local_258.m_message.px = (element_type *)0xf66cac;
            local_160[8] = false;
            local_160._0_8_ = &PTR__lazy_ostream_01389048;
            local_150[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
            local_580 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
            ;
            local_578 = "";
            pvVar15 = (iterator)0x1;
            pvVar16 = (iterator)0x0;
            local_150[0]._8_8_ = (lazy_ostream *)&local_258;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_108,(lazy_ostream *)local_160,1,0,WARN,
                       (check_type)pcVar14,(size_t)&local_580,0xb6);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)&aaStack_f8[0]._M_allocated_capacity);
            local_590 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
            ;
            local_588 = "";
            local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
            local_598 = &boost::unit_test::basic_cstring<char_const>::null;
            file_14.m_end = (iterator)0xb7;
            file_14.m_begin = (iterator)&local_590;
            msg_14.m_end = pvVar16;
            msg_14.m_begin = pvVar15;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,
                       (size_t)&local_5a0,msg_14);
            pbVar3 = local_650._M_impl.super__Vector_impl_data._M_start;
            local_160._0_8_ = local_150;
            std::__cxx11::basic_string<char,std::char_traits<char>,secure_allocator<char>>::
            _M_construct<char_const*>
                      ((basic_string<char,std::char_traits<char>,secure_allocator<char>> *)local_160
                       ,"encrypt","");
            bVar4 = CWallet::Unlock((CWallet *)pbVar3,(SecureString *)local_160);
            local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
            value = (readonly_property<bool>)(readonly_property<bool>)bVar4;
            local_258.m_message.px = (element_type *)0x0;
            local_258.m_message.pn.pi_ = (sp_counted_base *)0x0;
            local_698._0_8_ = "wallet->Unlock(\"encrypt\")";
            local_698.m_message.px = (element_type *)0xf66cc6;
            local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
            local_108[0] = (class_property<bool>)0x48;
            local_108._1_7_ = 0x13890;
            aaStack_f8[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
            local_5b0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
            ;
            local_5a8 = "";
            pvVar15 = (iterator)0x1;
            pvVar16 = (iterator)0x0;
            aaStack_f8[0]._8_8_ = &local_698;
            boost::test_tools::tt_detail::report_assertion
                      (&local_258,(lazy_ostream *)local_108,1,0,WARN,(check_type)pcVar14,
                       (size_t)&local_5b0,0xb7);
            boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._0_8_ != local_150) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::
              _M_destroy((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)
                         local_160,local_150[0]._M_allocated_capacity);
            }
            local_5c0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
            ;
            local_5b8 = "";
            local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
            local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
            file_15.m_end = &DAT_000000b8;
            file_15.m_begin = (iterator)&local_5c0;
            msg_15.m_end = pvVar16;
            msg_15.m_begin = pvVar15;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,
                       (size_t)&local_5d0,msg_15);
            pWVar2 = (((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                        *)((long)local_650._M_impl.super__Vector_impl_data._M_start + 0xe0))->_M_t).
                     super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                     .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
            if (pWVar2 != (WalletDatabase *)0x0) {
              local_108[0] = HasAnyRecordOfType(pWVar2,(string *)&DBKeys::CRYPTED_KEY_abi_cxx11_);
              ar_00 = (assertion_result *)local_108;
              local_108._8_8_ = (element_type *)0x0;
              aaStack_f8[0]._M_allocated_capacity = (sp_counted_base *)0x0;
              local_258._0_8_ = "HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY)";
              local_258.m_message.px = (element_type *)0xf66cac;
              local_160[8] = false;
              local_160._0_8_ = &PTR__lazy_ostream_01389048;
              local_150[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
              local_5e0 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
              ;
              local_5d8 = "";
              uVar17 = 0;
              uVar18 = 0;
              pvVar15 = (iterator)0x1;
              pvVar16 = (iterator)0x0;
              local_150[0]._8_8_ = &local_258;
              boost::test_tools::tt_detail::report_assertion
                        (ar_00,(lazy_ostream *)local_160,1,0,WARN,(check_type)pcVar14,
                         (size_t)&local_5e0,0xb8);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aaStack_f8[0]._M_allocated_capacity);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_650._M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_650._M_impl.super__Vector_impl_data._M_finish);
              }
              pmVar12 = std::
                        map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                        ::operator[]((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                                      *)&local_80,(key_type *)&local_278);
              std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::resize
                        (pmVar12,(size_type)
                                 (local_298._M_impl.super__Vector_impl_data._M_finish +
                                 (-0x20 - (long)local_298._M_impl.super__Vector_impl_data._M_start))
                        );
              pmVar12 = std::
                        map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                        ::operator[]((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                                      *)&local_80,(key_type *)&local_278);
              std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::resize
                        (pmVar12,(long)local_298._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_298._M_impl.super__Vector_impl_data._M_start);
              pCVar9 = (CWallet *)operator_new(0x4a8);
              pCVar1 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chain._M_t.
                       super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                       .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
              local_160._0_8_ = local_150;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"","");
              std::
              _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
              ::_Rb_tree(&local_1f0,&local_80);
              records_03._M_t._M_impl._4_4_ = uVar18;
              records_03._M_t._M_impl._0_4_ = uVar17;
              records_03._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pcVar14;
              records_03._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)psVar19
              ;
              records_03._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pcVar20;
              records_03._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)ar;
              records_03._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   in_stack_fffffffffffff950;
              CreateMockableWalletDatabase((wallet *)&local_5e8,records_03);
              psVar19 = (string *)local_160;
              CWallet::CWallet(pCVar9,pCVar1,psVar19,
                               (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                                )&local_5e8);
              local_650._M_impl.super__Vector_impl_data._M_start = (pointer)pCVar9;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<wallet::CWallet*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_650._M_impl.super__Vector_impl_data._M_finish,pCVar9);
              if (local_5e8 != (long *)0x0) {
                (**(code **)(*local_5e8 + 8))();
              }
              local_5e8 = (long *)0x0;
              std::
              _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
              ::~_Rb_tree(&local_1f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._0_8_ != local_150) {
                operator_delete((void *)local_160._0_8_,
                                (ulong)(local_150[0]._M_allocated_capacity + 1));
              }
              local_5f8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
              ;
              local_5f0 = "";
              local_608 = &boost::unit_test::basic_cstring<char_const>::null;
              local_600 = &boost::unit_test::basic_cstring<char_const>::null;
              file_16.m_end = (iterator)0xc5;
              file_16.m_begin = (iterator)&local_5f8;
              msg_16.m_end = pvVar16;
              msg_16.m_begin = pvVar15;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,
                         (size_t)&local_608,msg_16);
              local_258.m_message.px =
                   (element_type *)((ulong)local_258.m_message.px & 0xffffffffffffff00);
              local_258._0_8_ = &PTR__lazy_ostream_01388f08;
              local_258.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_240 = "";
              DVar8 = CWallet::LoadWallet((CWallet *)
                                          local_650._M_impl.super__Vector_impl_data._M_start);
              local_340._0_4_ = DVar8;
              local_260 = (undefined4 *)CONCAT44(local_260._4_4_,9);
              local_698.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
              value = (readonly_property<bool>)(readonly_property<bool>)(DVar8 == CORRUPT);
              local_698.m_message.px = (element_type *)0x0;
              local_698.m_message.pn.pi_ = (sp_counted_base *)0x0;
              local_50._0_8_ =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
              ;
              local_50.m_message.px = (element_type *)0xf668d3;
              local_230._0_8_ = local_340;
              local_160[8] = false;
              local_160._0_8_ = &PTR__lazy_ostream_01390308;
              local_150[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
              local_150[0]._8_8_ = local_230;
              local_2e0 = (undefined1  [8])&local_260;
              local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
              local_108._0_8_ = &PTR__lazy_ostream_01390308;
              aaStack_f8[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
              aaStack_f8[0]._8_8_ = local_2e0;
              pcVar20 = "DBErrors::CORRUPT";
              pcVar14 = "wallet->LoadWallet()";
              pvVar15 = (iterator)0x1;
              pvVar16 = (iterator)0x2;
              boost::test_tools::tt_detail::report_assertion
                        (&local_698,(lazy_ostream *)&local_258,1,2,REQUIRE,0xf653ba,
                         (size_t)&local_50,0xc5);
              boost::detail::shared_count::~shared_count(&local_698.m_message.pn);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_650._M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_650._M_impl.super__Vector_impl_data._M_finish);
              }
              local_160[0] = 0xff;
              local_618 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
              ;
              local_610 = "";
              local_628 = &boost::unit_test::basic_cstring<char_const>::null;
              local_620 = &boost::unit_test::basic_cstring<char_const>::null;
              file_17.m_end = (iterator)0xcc;
              file_17.m_begin = (iterator)&local_618;
              msg_17.m_end = pvVar16;
              msg_17.m_begin = pvVar15;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,
                         (size_t)&local_628,msg_17);
              if ((local_160[0] & 0xfe) == 2) {
                uVar6 = 0;
              }
              else {
                uVar6 = 1;
                if ((byte)local_160[0] < 8) {
                  uVar6 = (undefined1)(0x10001010101 >> ((local_160[0] & 7) << 3));
                }
              }
              local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
              value = (readonly_property<bool>)(readonly_property<bool>)uVar6;
              local_258.m_message.px = (element_type *)0x0;
              local_258.m_message.pn.pi_ = (sp_counted_base *)0x0;
              local_698._0_8_ = "!invalid_key.IsValid()";
              local_698.m_message.px = (element_type *)0xf66cdd;
              local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
              local_108._0_8_ = &PTR__lazy_ostream_01389048;
              aaStack_f8[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
              local_638 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
              ;
              local_630 = "";
              uVar17 = 0;
              uVar18 = 0;
              pvVar15 = (iterator)0x1;
              pvVar16 = (iterator)0x0;
              pCVar13 = (CPubKey *)0xcc;
              aaStack_f8[0]._8_8_ = &local_698;
              boost::test_tools::tt_detail::report_assertion
                        (&local_258,(lazy_ostream *)local_108,1,0,WARN,(check_type)pcVar14,
                         (size_t)&local_638,0xcc);
              boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
              MakeSerializeData<std::__cxx11::string,CPubKey>
                        ((SerializeData *)&local_650,
                         (walletload_tests *)&DBKeys::CRYPTED_KEY_abi_cxx11_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_160,pCVar13);
              pmVar12 = std::
                        map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                        ::operator[]((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                                      *)&local_80,(key_type *)&local_650);
              std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::operator=
                        (pmVar12,(vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
                                 &local_298);
              pCVar9 = (CWallet *)operator_new(0x4a8);
              pCVar1 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chain._M_t.
                       super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                       .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
              local_108._0_8_ = aaStack_f8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"","");
              std::
              _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
              ::_Rb_tree(&local_220,&local_80);
              records_04._M_t._M_impl._4_4_ = uVar18;
              records_04._M_t._M_impl._0_4_ = uVar17;
              records_04._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pcVar14;
              records_04._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)psVar19
              ;
              records_04._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pcVar20;
              records_04._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)ar_00;
              records_04._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   in_stack_fffffffffffff950;
              CreateMockableWalletDatabase((wallet *)&local_658,records_04);
              CWallet::CWallet(pCVar9,pCVar1,(string *)local_108,
                               (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                                )&local_658);
              local_2e0 = (undefined1  [8])pCVar9;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<wallet::CWallet*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2d8,pCVar9);
              if (local_658 != (long *)0x0) {
                (**(code **)(*local_658 + 8))();
              }
              local_658 = (long *)0x0;
              std::
              _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
              ::~_Rb_tree(&local_220);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._0_8_ != aaStack_f8) {
                operator_delete((void *)local_108._0_8_,
                                (ulong)(aaStack_f8[0]._M_allocated_capacity + 1));
              }
              local_668 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
              ;
              local_660 = "";
              local_678 = &boost::unit_test::basic_cstring<char_const>::null;
              local_670 = &boost::unit_test::basic_cstring<char_const>::null;
              file_18.m_end = (iterator)0xd1;
              file_18.m_begin = (iterator)&local_668;
              msg_18.m_end = pvVar16;
              msg_18.m_begin = pvVar15;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,
                         (size_t)&local_678,msg_18);
              local_698.m_message.px =
                   (element_type *)((ulong)local_698.m_message.px & 0xffffffffffffff00);
              local_698._0_8_ = &PTR__lazy_ostream_01388f08;
              local_698.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_680 = "";
              local_69c = CWallet::LoadWallet((CWallet *)local_2e0);
              local_340._0_8_ = &local_69c;
              local_260 = &local_6a0;
              local_6a0 = 9;
              local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
              value = (readonly_property<bool>)(readonly_property<bool>)(local_69c == CORRUPT);
              local_50.m_message.px = (element_type *)0x0;
              local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
              local_230._0_8_ =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
              ;
              local_230._8_8_ = "";
              local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
              local_108._0_8_ = &PTR__lazy_ostream_01390308;
              aaStack_f8[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
              aaStack_f8[0]._8_8_ = local_340;
              local_258.m_message.px =
                   (element_type *)((ulong)local_258.m_message.px & 0xffffffffffffff00);
              local_258._0_8_ = &PTR__lazy_ostream_01390308;
              local_258.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_240 = (char *)&local_260;
              boost::test_tools::tt_detail::report_assertion
                        (&local_50,(lazy_ostream *)&local_698,1,2,REQUIRE,0xf653ba,(size_t)local_230
                         ,0xd1,(string *)local_108,"DBErrors::CORRUPT",&local_258);
              boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._M_head_impl !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._M_head_impl);
              }
              std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                        (&local_650);
              std::
              _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
              ::~_Rb_tree(&local_80);
              std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                        (&local_298);
              std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                        (&local_278);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                return;
              }
              __stack_chk_fail();
            }
          }
        }
      }
    }
  }
  __assert_fail("static_cast<bool>(m_database)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
}

Assistant:

BOOST_FIXTURE_TEST_CASE(wallet_load_ckey, TestingSetup)
{
    SerializeData ckey_record_key;
    SerializeData ckey_record_value;
    MockableData records;

    {
        // Context setup.
        // Create and encrypt legacy wallet
        std::shared_ptr<CWallet> wallet(new CWallet(m_node.chain.get(), "", CreateMockableWalletDatabase()));
        LOCK(wallet->cs_wallet);
        auto legacy_spkm = wallet->GetOrCreateLegacyScriptPubKeyMan();
        BOOST_CHECK(legacy_spkm->SetupGeneration(true));

        // Retrieve a key
        CTxDestination dest = *Assert(legacy_spkm->GetNewDestination(OutputType::LEGACY));
        CKeyID key_id = GetKeyForDestination(*legacy_spkm, dest);
        CKey first_key;
        BOOST_CHECK(legacy_spkm->GetKey(key_id, first_key));

        // Encrypt the wallet
        BOOST_CHECK(wallet->EncryptWallet("encrypt"));
        wallet->Flush();

        // Store a copy of all the records
        records = GetMockableDatabase(*wallet).m_records;

        // Get the record for the retrieved key
        ckey_record_key = MakeSerializeData(DBKeys::CRYPTED_KEY, first_key.GetPubKey());
        ckey_record_value = records.at(ckey_record_key);
    }

    {
        // First test case:
        // Erase all the crypted keys from db and unlock the wallet.
        // The wallet will only re-write the crypted keys to db if any checksum is missing at load time.
        // So, if any 'ckey' record re-appears on db, then the checksums were not properly calculated, and we are re-writing
        // the records every time that 'CWallet::Unlock' gets called, which is not good.

        // Load the wallet and check that is encrypted
        std::shared_ptr<CWallet> wallet(new CWallet(m_node.chain.get(), "", CreateMockableWalletDatabase(records)));
        BOOST_CHECK_EQUAL(wallet->LoadWallet(), DBErrors::LOAD_OK);
        BOOST_CHECK(wallet->IsCrypted());
        BOOST_CHECK(HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY));

        // Now delete all records and check that the 'Unlock' function doesn't re-write them
        BOOST_CHECK(wallet->GetLegacyScriptPubKeyMan()->DeleteRecords());
        BOOST_CHECK(!HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY));
        BOOST_CHECK(wallet->Unlock("encrypt"));
        BOOST_CHECK(!HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY));
    }

    {
        // Second test case:
        // Verify that loading up a 'ckey' with no checksum triggers a complete re-write of the crypted keys.

        // Cut off the 32 byte checksum from a ckey record
        records[ckey_record_key].resize(ckey_record_value.size() - 32);

        // Load the wallet and check that is encrypted
        std::shared_ptr<CWallet> wallet(new CWallet(m_node.chain.get(), "", CreateMockableWalletDatabase(records)));
        BOOST_CHECK_EQUAL(wallet->LoadWallet(), DBErrors::LOAD_OK);
        BOOST_CHECK(wallet->IsCrypted());
        BOOST_CHECK(HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY));

        // Now delete all ckey records and check that the 'Unlock' function re-writes them
        // (this is because the wallet, at load time, found a ckey record with no checksum)
        BOOST_CHECK(wallet->GetLegacyScriptPubKeyMan()->DeleteRecords());
        BOOST_CHECK(!HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY));
        BOOST_CHECK(wallet->Unlock("encrypt"));
        BOOST_CHECK(HasAnyRecordOfType(wallet->GetDatabase(), DBKeys::CRYPTED_KEY));
    }

    {
        // Third test case:
        // Verify that loading up a 'ckey' with an invalid checksum throws an error.

        // Cut off the 32 byte checksum from a ckey record
        records[ckey_record_key].resize(ckey_record_value.size() - 32);
        // Fill in the checksum space with 0s
        records[ckey_record_key].resize(ckey_record_value.size());

        std::shared_ptr<CWallet> wallet(new CWallet(m_node.chain.get(), "", CreateMockableWalletDatabase(records)));
        BOOST_CHECK_EQUAL(wallet->LoadWallet(), DBErrors::CORRUPT);
    }

    {
        // Fourth test case:
        // Verify that loading up a 'ckey' with an invalid pubkey throws an error
        CPubKey invalid_key;
        BOOST_CHECK(!invalid_key.IsValid());
        SerializeData key = MakeSerializeData(DBKeys::CRYPTED_KEY, invalid_key);
        records[key] = ckey_record_value;

        std::shared_ptr<CWallet> wallet(new CWallet(m_node.chain.get(), "", CreateMockableWalletDatabase(records)));
        BOOST_CHECK_EQUAL(wallet->LoadWallet(), DBErrors::CORRUPT);
    }
}